

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcStyledItem::IfcStyledItem(IfcStyledItem *this,void **vtt)

{
  _func_int **pp_Var1;
  void *pvVar2;
  
  IfcRepresentationItem::IfcRepresentationItem((IfcRepresentationItem *)this,vtt + 1);
  pp_Var1 = (_func_int **)vtt[5];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>)._vptr_ObjectHelper =
       pp_Var1;
  *(void **)(pp_Var1[-3] +
            (long)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).
                   _vptr_ObjectHelper) = vtt[6];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  pvVar2 = *vtt;
  *(void **)this = pvVar2;
  *(void **)(&this->field_0x0 + *(long *)((long)pvVar2 + -0x18)) = vtt[7];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>)._vptr_ObjectHelper =
       (_func_int **)vtt[8];
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).field_0x10
       = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).field_0x18 = 0;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).field_0x20
       = 0;
  *(undefined8 *)&this->field_0x38 = 0;
  *(undefined8 *)&this->field_0x40 = 0;
  (this->Name).ptr._M_dataplus._M_p = (pointer)&(this->Name).ptr.field_2;
  (this->Name).ptr._M_string_length = 0;
  (this->Name).ptr.field_2._M_local_buf[0] = '\0';
  (this->Name).have = false;
  return;
}

Assistant:

IfcStyledItem() : Object("IfcStyledItem") {}